

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

DynamicProfileInfo *
Js::DynamicProfileInfo::New
          (Recycler *recycler,FunctionBody *functionBody,bool persistsAcrossScriptContexts)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  Recycler *pRVar5;
  DynamicProfileInfo *this;
  undefined4 *puVar6;
  type_info *ptVar7;
  DynamicProfileInfo *ptr;
  undefined1 local_140 [8];
  TrackAllocData data;
  Allocation batch [14];
  
  data.line = 8;
  FunctionBody::GetProfiledCallApplyCallSiteCount(functionBody);
  FunctionBody::GetInlineCacheCount(functionBody);
  bVar2 = IsEnabled(functionBody);
  if (bVar2) {
    FunctionBody::GetLoopCount(functionBody);
  }
  uVar3 = FunctionBody::GetLoopCount(functionBody);
  if (uVar3 != 0) {
    uVar3 = FunctionBody::GetLoopCount(functionBody);
    BVFixed::GetAllocSize(uVar3 * 2);
  }
  ptVar7 = (type_info *)0x0;
  for (lVar4 = 8; lVar4 != 0xe8; lVar4 = lVar4 + 0x10) {
    ptVar7 = ptVar7 + *(long *)((long)batch + lVar4 + -8);
  }
  data.typeinfo = ptVar7;
  if (persistsAcrossScriptContexts) {
    local_140 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4871496;
    data.filename._0_4_ = 0x5e;
    pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_140);
    this = (DynamicProfileInfo *)new<Memory::Recycler>(0xa8,pRVar5,0x398e98,0);
    DynamicProfileInfo(this,functionBody);
    this->persistsAcrossScriptContexts = true;
  }
  else {
    local_140 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4871496;
    data.filename._0_4_ = 0x68;
    pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_140);
    this = (DynamicProfileInfo *)new<Memory::Recycler>(0xa8,pRVar5,0x398e98,0);
    DynamicProfileInfo(this,functionBody);
  }
  ptr = this + 1;
  for (lVar4 = 8; lVar4 != 0xe8; lVar4 = lVar4 + 0x10) {
    if (*(long *)((long)batch + lVar4 + -8) != 0) {
      Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierSet
                ((WriteBarrierPtr<unsigned_char> *)
                 ((long)&(this->dynamicProfileFunctionInfo).ptr +
                 (ulong)*(uint *)((long)&batch[-1].offset + lVar4)),(uchar *)ptr);
      ptr = (DynamicProfileInfo *)
            ((long)&(ptr->dynamicProfileFunctionInfo).ptr + *(long *)((long)batch + lVar4 + -8));
    }
  }
  if ((type_info *)((long)ptr + (-0xa8 - (long)this)) != ptVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x7b,
                                "(current - reinterpret_cast<BYTE*>(info) - sizeof(DynamicProfileInfo) == totalAlloc)"
                                ,
                                "current - reinterpret_cast<BYTE*>(info) - sizeof(DynamicProfileInfo) == totalAlloc"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  Initialize(this,functionBody);
  return this;
}

Assistant:

DynamicProfileInfo* DynamicProfileInfo::New(Recycler* recycler, FunctionBody* functionBody, bool persistsAcrossScriptContexts)
    {
        size_t totalAlloc = 0;
        Allocation batch[] =
        {
            { (uint)offsetof(DynamicProfileInfo, callSiteInfo), functionBody->GetProfiledCallSiteCount() * sizeof(CallSiteInfo) },
            { (uint)offsetof(DynamicProfileInfo, callApplyTargetInfo), functionBody->GetProfiledCallApplyCallSiteCount() * sizeof(CallSiteInfo) },
            { (uint)offsetof(DynamicProfileInfo, ldLenInfo), functionBody->GetProfiledLdLenCount() * sizeof(LdLenInfo) },
            { (uint)offsetof(DynamicProfileInfo, ldElemInfo), functionBody->GetProfiledLdElemCount() * sizeof(LdElemInfo) },
            { (uint)offsetof(DynamicProfileInfo, stElemInfo), functionBody->GetProfiledStElemCount() * sizeof(StElemInfo) },
            { (uint)offsetof(DynamicProfileInfo, arrayCallSiteInfo), functionBody->GetProfiledArrayCallSiteCount() * sizeof(ArrayCallSiteInfo) },
            { (uint)offsetof(DynamicProfileInfo, fldInfo), functionBody->GetProfiledFldCount() * sizeof(FldInfo) },
            { (uint)offsetof(DynamicProfileInfo, divideTypeInfo), functionBody->GetProfiledDivOrRemCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, switchTypeInfo), functionBody->GetProfiledSwitchCount() * sizeof(ValueType)},
            { (uint)offsetof(DynamicProfileInfo, slotInfo), functionBody->GetProfiledSlotCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, parameterInfo), functionBody->GetProfiledInParamsCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, returnTypeInfo), functionBody->GetProfiledReturnTypeCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, loopImplicitCallFlags), (EnableImplicitCallFlags(functionBody) ? (functionBody->GetLoopCount() * sizeof(ImplicitCallFlags)) : 0) },
            { (uint)offsetof(DynamicProfileInfo, loopFlags), functionBody->GetLoopCount() ? BVFixed::GetAllocSize(functionBody->GetLoopCount() * LoopFlags::COUNT) : 0 }
        };

        for (uint i = 0; i < _countof(batch); i++)
        {
            totalAlloc += batch[i].size;
        }

        DynamicProfileInfo* info = nullptr;

        // In the profile storage case (-only), always allocate a non-leaf profile
        // In the regular profile case, we need to allocate it as non-leaf only if it's
        // a profile being used in the in-memory cache. This is because in that case, the profile
        // also allocates dynamicProfileFunctionInfo, which it uses to match functions across
        // script contexts. In the normal case, since we don't allocate that structure, we
        // can be a leaf allocation.
        if (persistsAcrossScriptContexts)
        {
            info = RecyclerNewPlusZ(recycler, totalAlloc, DynamicProfileInfo, functionBody);
#if DBG
            info->persistsAcrossScriptContexts = true;
#endif
        }
        else
        {
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
            if (DynamicProfileInfo::NeedProfileInfoList())
            {
                info = RecyclerNewPlusZ(recycler, totalAlloc, DynamicProfileInfo, functionBody);
            }
            else
#endif
            {
                info = RecyclerNewPlusLeafZ(recycler, totalAlloc, DynamicProfileInfo, functionBody);
            }
        }
        BYTE* current = (BYTE*)info + sizeof(DynamicProfileInfo);

        for (uint i = 0; i < _countof(batch); i++)
        {
            if (batch[i].size > 0)
            {
                Field(BYTE*)* field = (Field(BYTE*)*)(((BYTE*)info + batch[i].offset));
                *field = current;
                current += batch[i].size;
            }
        }
        Assert(current - reinterpret_cast<BYTE*>(info) - sizeof(DynamicProfileInfo) == totalAlloc);

        info->Initialize(functionBody);
        return info;
    }